

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::Add
          (TPZMatrix<long_double> *this,TPZMatrix<long_double> *A,TPZMatrix<long_double> *res)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  long lVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  TPZFMatrixRef<long_double> ref;
  longdouble local_158 [9];
  TPZFMatrix<long_double> local_c0;
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix) <different dimensions>",(char *)0x0);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar6 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
  if (CONCAT44(extraout_var,iVar5) == CONCAT44(extraout_var_00,iVar6)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar7 = __dynamic_cast(res,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
    if (lVar7 != 0) {
      lVar7 = __dynamic_cast(A,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
      lVar8 = __dynamic_cast(this,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
      if ((lVar8 == 0) || (lVar7 == 0)) {
        if ((this->super_TPZBaseMatrix).fRow < 1) {
          return;
        }
        lVar7 = 0;
        do {
          if (0 < (this->super_TPZBaseMatrix).fCol) {
            lVar8 = 0;
            lVar9 = in_ST0;
            lVar10 = in_ST1;
            lVar1 = in_ST2;
            lVar2 = in_ST3;
            lVar3 = in_ST4;
            lVar4 = in_ST5;
            do {
              in_ST5 = in_ST7;
              in_ST4 = in_ST6;
              in_ST3 = lVar4;
              in_ST2 = lVar3;
              in_ST1 = lVar2;
              in_ST0 = lVar1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar7,lVar8);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar7,lVar8);
              local_158[0] = lVar9 + lVar10;
              in_ST6 = in_ST5;
              in_ST7 = in_ST5;
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar7,lVar8,local_158);
              lVar8 = lVar8 + 1;
              lVar9 = in_ST0;
              lVar10 = in_ST1;
              lVar1 = in_ST2;
              lVar2 = in_ST3;
              lVar3 = in_ST4;
              lVar4 = in_ST5;
            } while (lVar8 < (this->super_TPZBaseMatrix).fCol);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (this->super_TPZBaseMatrix).fRow);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    Storage(&local_c0,A);
    iVar5 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(res);
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    iVar6 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    TPZFMatrixRef<long_double>::TPZFMatrixRef
              ((TPZFMatrixRef<long_double> *)local_158,CONCAT44(extraout_var_01,iVar5),
               (longdouble **)CONCAT44(extraout_var_02,iVar6));
    TPZFMatrix<long_double>::operator+=
              ((TPZFMatrix<long_double> *)local_158,&local_c0.super_TPZMatrix<long_double>);
    TPZFMatrixRef<long_double>::~TPZFMatrixRef
              ((TPZFMatrixRef<long_double> *)local_158,&TPZFMatrixRef<long_double>::VTT);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<long double>::Add(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = long double]"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x67c);
}

Assistant:

void TPZMatrix<TVar>::Add(const TPZMatrix<TVar>&A,TPZMatrix<TVar>&res) const {
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix) <different dimensions>" );
	}
  if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)+A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() += A.Storage();
  }
  
}